

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiViewportP **ppIVar3;
  ImGuiID IVar4;
  int iVar5;
  ImGuiSettingsHandler *__dest;
  ImGuiViewportP *pIVar6;
  ImGuiViewportP **__dest_00;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    IVar4 = ImHashStr("Window",0,0);
    iVar5 = (context->SettingsHandlers).Size;
    if (iVar5 == (context->SettingsHandlers).Capacity) {
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      iVar8 = iVar5 + 1;
      if (iVar5 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar8 * 0x48,GImAllocatorUserData);
      pIVar2 = (context->SettingsHandlers).Data;
      if (pIVar2 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar2,(long)(context->SettingsHandlers).Size * 0x48);
        pIVar2 = (context->SettingsHandlers).Data;
        if ((pIVar2 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      (context->SettingsHandlers).Data = __dest;
      (context->SettingsHandlers).Capacity = iVar8;
      iVar5 = (context->SettingsHandlers).Size;
    }
    else {
      __dest = (context->SettingsHandlers).Data;
    }
    __dest[iVar5].TypeName = "Window";
    __dest[iVar5].TypeHash = IVar4;
    *(undefined4 *)&__dest[iVar5].field_0xc = 0;
    __dest[iVar5].ClearAllFn = WindowSettingsHandler_ClearAll;
    __dest[iVar5].ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    __dest[iVar5].ReadOpenFn = WindowSettingsHandler_ReadOpen;
    __dest[iVar5].ReadLineFn = WindowSettingsHandler_ReadLine;
    __dest[iVar5].ApplyAllFn = WindowSettingsHandler_ApplyAll;
    __dest[iVar5].WriteAllFn = WindowSettingsHandler_WriteAll;
    __dest[iVar5].UserData = (void *)0x0;
    (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
    TableSettingsInstallHandler(context);
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar6 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0xb0,GImAllocatorUserData);
    auVar9 = ZEXT1632(ZEXT816(0) << 0x40);
    (pIVar6->super_ImGuiViewport).Flags = auVar9._0_4_;
    (pIVar6->super_ImGuiViewport).Pos.x = (float)(int)auVar9._4_8_;
    (pIVar6->super_ImGuiViewport).Pos.y = (float)(int)((ulong)auVar9._4_8_ >> 0x20);
    (pIVar6->super_ImGuiViewport).Size.x = (float)(int)auVar9._12_8_;
    (pIVar6->super_ImGuiViewport).Size.y = (float)(int)((ulong)auVar9._12_8_ >> 0x20);
    (pIVar6->super_ImGuiViewport).WorkPos.x = (float)(int)auVar9._20_8_;
    (pIVar6->super_ImGuiViewport).WorkPos.y = (float)(int)((ulong)auVar9._20_8_ >> 0x20);
    (pIVar6->super_ImGuiViewport).WorkSize.x = (float)auVar9._28_4_;
    (pIVar6->super_ImGuiViewport).WorkSize.y = 0.0;
    (pIVar6->DrawDataP).Valid = (bool)auVar9[0];
    *(int3 *)&(pIVar6->DrawDataP).field_0x1 = auVar9._1_3_;
    (pIVar6->DrawDataP).CmdListsCount = auVar9._4_4_;
    (pIVar6->DrawDataP).TotalIdxCount = auVar9._8_4_;
    (pIVar6->DrawDataP).TotalVtxCount = auVar9._12_4_;
    (pIVar6->DrawDataP).CmdLists = (ImDrawList **)auVar9._16_8_;
    (pIVar6->DrawDataP).DisplayPos.x = (float)(int)auVar9._24_8_;
    (pIVar6->DrawDataP).DisplayPos.y = (float)(int)((ulong)auVar9._24_8_ >> 0x20);
    auVar9 = ZEXT1632(ZEXT816(0) << 0x40);
    *(undefined1 (*) [32])&(pIVar6->DrawDataP).DisplaySize = auVar9;
    *(undefined1 (*) [32])((pIVar6->DrawDataBuilder).Layers + 1) = auVar9;
    (pIVar6->WorkOffsetMin).x = (float)(int)auVar9._0_8_;
    (pIVar6->WorkOffsetMin).y = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
    (pIVar6->WorkOffsetMax).x = (float)(int)auVar9._8_8_;
    (pIVar6->WorkOffsetMax).y = (float)(int)((ulong)auVar9._8_8_ >> 0x20);
    (pIVar6->CurrWorkOffsetMin).x = (float)(int)auVar9._16_8_;
    (pIVar6->CurrWorkOffsetMin).y = (float)(int)((ulong)auVar9._16_8_ >> 0x20);
    (pIVar6->CurrWorkOffsetMax).x = (float)(int)auVar9._24_8_;
    (pIVar6->CurrWorkOffsetMax).y = (float)(int)((ulong)auVar9._24_8_ >> 0x20);
    pIVar6->DrawListsLastFrame[0] = -1;
    pIVar6->DrawListsLastFrame[1] = -1;
    *(undefined1 (*) [16])pIVar6->DrawLists = ZEXT416(0) << 0x40;
    iVar5 = (context->Viewports).Size;
    if (iVar5 == (context->Viewports).Capacity) {
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      iVar8 = iVar5 + 1;
      if (iVar5 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_00 = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData)
      ;
      ppIVar3 = (context->Viewports).Data;
      if (ppIVar3 != (ImGuiViewportP **)0x0) {
        memcpy(__dest_00,ppIVar3,(long)(context->Viewports).Size << 3);
        ppIVar3 = (context->Viewports).Data;
        if ((ppIVar3 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      (context->Viewports).Data = __dest_00;
      (context->Viewports).Capacity = iVar8;
      iVar5 = (context->Viewports).Size;
    }
    else {
      __dest_00 = (context->Viewports).Data;
    }
    __dest_00[iVar5] = pIVar6;
    (context->Viewports).Size = (context->Viewports).Size + 1;
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xfe1,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);
#endif // #ifdef IMGUI_HAS_TABLE

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}